

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int cram_flush_result(cram_fd *fd)

{
  undefined8 *puVar1;
  cram_container *c_00;
  int iVar2;
  uint uVar3;
  t_pool_result *r_00;
  cram_container *c;
  cram_job *j;
  t_pool_result *r;
  int ret;
  int i;
  cram_fd *fd_local;
  
  r._0_4_ = 0;
  _ret = fd;
  while( true ) {
    r_00 = t_pool_next_result(_ret->rqueue);
    if (r_00 == (t_pool_result *)0x0) {
      return (uint)r;
    }
    puVar1 = (undefined8 *)r_00->data;
    if (puVar1 == (undefined8 *)0x0) break;
    _ret = (cram_fd *)*puVar1;
    c_00 = (cram_container *)puVar1[1];
    iVar2 = cram_flush_container2(_ret,c_00);
    if (iVar2 != 0) {
      return -1;
    }
    for (r._4_4_ = 0; r._4_4_ < c_00->max_slice; r._4_4_ = r._4_4_ + 1) {
      cram_free_slice(c_00->slices[r._4_4_]);
      c_00->slices[r._4_4_] = (cram_slice *)0x0;
    }
    c_00->slice = (cram_slice *)0x0;
    c_00->curr_slice = 0;
    cram_free_container(c_00);
    iVar2 = hflush(_ret->fp);
    uVar3 = 0xffffffff;
    if (iVar2 == 0) {
      uVar3 = 0;
    }
    r._0_4_ = uVar3 | (uint)r;
    t_pool_delete_result(r_00,1);
  }
  t_pool_delete_result(r_00,0);
  return -1;
}

Assistant:

static int cram_flush_result(cram_fd *fd) {
    int i, ret = 0;
    t_pool_result *r;

    while ((r = t_pool_next_result(fd->rqueue))) {
	cram_job *j = (cram_job *)r->data;
	cram_container *c;

	if (!j) {
	    t_pool_delete_result(r, 0);
	    return -1;
	}

	fd = j->fd;
	c = j->c;

	if (0 != cram_flush_container2(fd, c))
	    return -1;

	/* Free the container */
	for (i = 0; i < c->max_slice; i++) {
	    cram_free_slice(c->slices[i]);
	    c->slices[i] = NULL;
	}

	c->slice = NULL;
	c->curr_slice = 0;

	cram_free_container(c);

	ret |= hflush(fd->fp) == 0 ? 0 : -1;

	t_pool_delete_result(r, 1);
    }

    return ret;
}